

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStreamClient.cpp
# Opt level: O3

Output_GetSegmentLocalRotationHelical * __thiscall
ViconDataStreamSDK::CPP::Client::GetSegmentLocalRotationHelical
          (Output_GetSegmentLocalRotationHelical *__return_storage_ptr__,Client *this,
          String *SubjectName,String *SegmentName)

{
  VClient *this_00;
  Enum EVar1;
  char *pcVar2;
  allocator local_59;
  string local_58;
  string local_38;
  
  this_00 = (this->m_pClientImpl->m_pCoreClient).
            super___shared_ptr<ViconDataStreamSDK::Core::VClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (SubjectName->m_pStringFactory == (IStringFactory *)0x0) {
    pcVar2 = SubjectName->m_pConstString;
  }
  else {
    pcVar2 = SubjectName->m_pString;
  }
  std::__cxx11::string::string((string *)&local_38,pcVar2,(allocator *)&local_58);
  if (SegmentName->m_pStringFactory == (IStringFactory *)0x0) {
    std::__cxx11::string::string((string *)&local_58,SegmentName->m_pConstString,&local_59);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,SegmentName->m_pString,&local_59);
  }
  EVar1 = Core::VClient::GetSegmentLocalRotationHelical
                    (this_00,&local_38,&local_58,&__return_storage_ptr__->Rotation,
                     &__return_storage_ptr__->Occluded);
  if ((EVar1 < (ConfigurationFailed|Success)) &&
     ((0x3fefffffU >> (EVar1 & (ConfigurationFailed|InvalidHostName)) & 1) != 0)) {
    __return_storage_ptr__->Result = *(Enum *)(&DAT_001703a8 + (ulong)EVar1 * 4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!\"Unexpected result code returned\"",
                "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDK_CPP/CoreAdapters.h"
                ,0x82,
                "ViconDataStreamSDK::CPP::Result::Enum Adapt(ViconDataStreamSDK::Core::Result::Enum)"
               );
}

Assistant:

CLASS_DECLSPEC
  Output_GetSegmentLocalRotationHelical Client::GetSegmentLocalRotationHelical( const String & SubjectName,
                                                                                const String & SegmentName ) const
  {
    Output_GetSegmentLocalRotationHelical Output;
    Output.Result = Adapt( m_pClientImpl->m_pCoreClient->GetSegmentLocalRotationHelical( SubjectName, 
                                                                                         SegmentName, 
                                                                                         Output.Rotation, 
                                                                                         Output.Occluded ) );

    return Output;
  }